

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlNameDefn.h
# Opt level: O2

void __thiscall GdlNameDefn::AddExtName(GdlNameDefn *this,utf16 wLangID,GdlExpression *pexp)

{
  GdlStringExpression *this_00;
  wstring stu;
  wstring wStack_a8;
  wstring local_88;
  GdlExtName local_68;
  
  this_00 = (GdlStringExpression *)
            __dynamic_cast(pexp,&GdlExpression::typeinfo,&GdlStringExpression::typeinfo,0);
  GdlStringExpression::ConvertToUnicode_abi_cxx11_(&local_88,this_00);
  std::__cxx11::wstring::wstring((wstring *)&wStack_a8,(wstring *)&local_88);
  GdlExtName::GdlExtName(&local_68,&wStack_a8,wLangID);
  std::vector<GdlExtName,_std::allocator<GdlExtName>_>::emplace_back<GdlExtName>
            (&this->m_vextname,&local_68);
  GdlExtName::~GdlExtName(&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&wStack_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_88);
  return;
}

Assistant:

void AddExtName(utf16 wLangID, GdlExpression * pexp)
	{
		GdlStringExpression * pexpString = dynamic_cast<GdlStringExpression*>(pexp);
		Assert(pexpString);

		std::wstring stu = pexpString->ConvertToUnicode();
		m_vextname.push_back(GdlExtName(stu, wLangID));
	}